

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iibmalloc.h
# Opt level: O2

void __thiscall
nodecpp::iibmalloc::
BulkAllocator<nodecpp::iibmalloc::PageAllocatorWithCaching,_8388608UL,_(unsigned_short)32>::
deallocate(BulkAllocator<nodecpp::iibmalloc::PageAllocatorWithCaching,_8388608UL,_(unsigned_short)32>
           *this,void *ptr)

{
  FreeChunkHeader *pFVar1;
  ushort uVar2;
  ushort uVar3;
  size_t deallocSize;
  AnyChunkHeader *h;
  anon_class_16_2_d70565c2 local_50;
  AnyChunkHeader *next;
  AnyChunkHeader *prev;
  
  local_50.h = &h;
  h = (AnyChunkHeader *)ptr;
  if ((*ptr & 0xfff) != 0) {
    assert::
    nodecpp_assert<2ul,(nodecpp::assert::AssertLevel)0,nodecpp::iibmalloc::BulkAllocator<nodecpp::iibmalloc::PageAllocatorWithCaching,8388608ul,(unsigned_short)32>::deallocate(void*)::_lambda()_1_>
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/iibmalloc.h"
               ,0x2c2,(anon_class_8_1_54a39808 *)&local_50,"h->getPageCount() <= max_pages");
    prev = (AnyChunkHeader *)(h->prev & 0xfffffffffffff000);
    if ((prev != (AnyChunkHeader *)0x0) && ((prev->next & 0xfff) != 0)) {
      local_50.h = &prev;
      assert::
      nodecpp_assert<2ul,(nodecpp::assert::AssertLevel)0,nodecpp::iibmalloc::BulkAllocator<nodecpp::iibmalloc::PageAllocatorWithCaching,8388608ul,(unsigned_short)32>::deallocate(void*)::_lambda()_2_>
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/iibmalloc.h"
                 ,0x2cb,(anon_class_8_1_89904f31 *)&local_50,
                 "prev->prevInBlock() == nullptr || !prev->prevInBlock()->isFree()");
      local_50.h = &prev;
      local_50.next = &h;
      assert::
      nodecpp_assert<2ul,(nodecpp::assert::AssertLevel)0,nodecpp::iibmalloc::BulkAllocator<nodecpp::iibmalloc::PageAllocatorWithCaching,8388608ul,(unsigned_short)32>::deallocate(void*)::_lambda()_3_>
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/iibmalloc.h"
                 ,0x2cc,(anon_class_16_2_fd1d4ce0 *)&local_50,"prev->nextInBlock() == h");
      local_50.h = &prev;
      local_50.next = &h;
      assert::
      nodecpp_assert<2ul,(nodecpp::assert::AssertLevel)0,nodecpp::iibmalloc::BulkAllocator<nodecpp::iibmalloc::PageAllocatorWithCaching,8388608ul,(unsigned_short)32>::deallocate(void*)::_lambda()_4_>
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/iibmalloc.h"
                 ,0x2cd,(anon_class_16_2_fd1d4ce0 *)&local_50,
                 "reinterpret_cast<uint8_t*>(prev->prevInBlock()) + ((uintptr_t)(prev->prevInBlock()->getPageCount()) << PAGE_SIZE_EXP) == reinterpret_cast<uint8_t*>( h )"
                );
      removeFromFreeList(this,(FreeChunkHeader *)prev);
      AnyChunkHeader::set(prev,(AnyChunkHeader *)(prev->prev & 0xfffffffffffff000),
                          (AnyChunkHeader *)(h->next & 0xfffffffffffff000),
                          ((ushort)h->prev & 0xfff) + ((ushort)prev->prev & 0xfff),true);
      h = prev;
    }
    next = (AnyChunkHeader *)(h->next & 0xfffffffffffff000);
    if ((next != (AnyChunkHeader *)0x0) && ((next->next & 0xfff) != 0)) {
      local_50.h = &next;
      assert::
      nodecpp_assert<2ul,(nodecpp::assert::AssertLevel)0,nodecpp::iibmalloc::BulkAllocator<nodecpp::iibmalloc::PageAllocatorWithCaching,8388608ul,(unsigned_short)32>::deallocate(void*)::_lambda()_5_>
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/iibmalloc.h"
                 ,0x2d5,(anon_class_8_1_898f37f1 *)&local_50,
                 "next->nextInBlock() == nullptr || !next->nextInBlock()->isFree()");
      local_50.h = &next;
      local_50.next = &h;
      assert::
      nodecpp_assert<2ul,(nodecpp::assert::AssertLevel)0,nodecpp::iibmalloc::BulkAllocator<nodecpp::iibmalloc::PageAllocatorWithCaching,8388608ul,(unsigned_short)32>::deallocate(void*)::_lambda()_6_>
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/iibmalloc.h"
                 ,0x2d6,(anon_class_16_2_fcfb7c20 *)&local_50,"next->prevInBlock() == h");
      local_50.h = &h;
      local_50.next = &next;
      assert::
      nodecpp_assert<2ul,(nodecpp::assert::AssertLevel)0,nodecpp::iibmalloc::BulkAllocator<nodecpp::iibmalloc::PageAllocatorWithCaching,8388608ul,(unsigned_short)32>::deallocate(void*)::_lambda()_7_>
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/iibmalloc.h"
                 ,0x2d7,&local_50,
                 "reinterpret_cast<uint8_t*>(h) + ((uintptr_t)(h->getPageCount()) << PAGE_SIZE_EXP) == reinterpret_cast<uint8_t*>( next )"
                );
      removeFromFreeList(this,(FreeChunkHeader *)next);
      AnyChunkHeader::set(h,(AnyChunkHeader *)(h->prev & 0xfffffffffffff000),
                          (AnyChunkHeader *)(next->next & 0xfffffffffffff000),
                          ((ushort)next->prev & 0xfff) + ((ushort)h->prev & 0xfff),true);
    }
    uVar2 = ((ushort)(((FreeChunkHeader *)h)->super_AnyChunkHeader).prev & 0xfff) - 1;
    uVar3 = 0x20;
    if (uVar2 < 0x20) {
      uVar3 = uVar2;
    }
    ((FreeChunkHeader *)h)->prevFree = (FreeChunkHeader *)0x0;
    pFVar1 = this->freeListBegin[uVar3];
    ((FreeChunkHeader *)h)->nextFree = pFVar1;
    if (pFVar1 != (FreeChunkHeader *)0x0) {
      pFVar1->prevFree = (FreeChunkHeader *)h;
    }
    this->freeListBegin[uVar3] = (FreeChunkHeader *)h;
    return;
  }
  PageAllocatorWithCaching::freeChunkNoCache(&this->super_PageAllocatorWithCaching,ptr,*ptr);
  return;
}

Assistant:

void deallocate( void* ptr )
	{
		AnyChunkHeader* h = reinterpret_cast<AnyChunkHeader*>( ptr );
		if ( h->getPageCount() != 0 )
		{
			NODECPP_ASSERT(nodecpp::iibmalloc::module_id, nodecpp::assert::AssertLevel::critical, h->getPageCount() <= max_pages );
#ifdef BULKALLOCATOR_HEAVY_DEBUG
		dbgValidateAllBlocks();
		dbgValidateAllFreeLists();
#endif

			AnyChunkHeader* prev = h->prevInBlock();
			if ( prev && prev->isFree() )
			{
				NODECPP_ASSERT(nodecpp::iibmalloc::module_id, nodecpp::assert::AssertLevel::critical, prev->prevInBlock() == nullptr || !prev->prevInBlock()->isFree() );
				NODECPP_ASSERT(nodecpp::iibmalloc::module_id, nodecpp::assert::AssertLevel::critical, prev->nextInBlock() == h );
				NODECPP_ASSERT(nodecpp::iibmalloc::module_id, nodecpp::assert::AssertLevel::critical, reinterpret_cast<uint8_t*>(prev->prevInBlock()) + ((uintptr_t)(prev->prevInBlock()->getPageCount()) << PAGE_SIZE_EXP) == reinterpret_cast<uint8_t*>( h ) );
				removeFromFreeList( static_cast<FreeChunkHeader*>(prev) );
				prev->set( prev->prevInBlock(), h->nextInBlock(), prev->getPageCount() + h->getPageCount(), true );
				h = prev;
			}
			AnyChunkHeader* next = h->nextInBlock();
			if ( next && next->isFree() )
			{
				NODECPP_ASSERT(nodecpp::iibmalloc::module_id, nodecpp::assert::AssertLevel::critical, next->nextInBlock() == nullptr || !next->nextInBlock()->isFree() );
				NODECPP_ASSERT(nodecpp::iibmalloc::module_id, nodecpp::assert::AssertLevel::critical, next->prevInBlock() == h );
				NODECPP_ASSERT(nodecpp::iibmalloc::module_id, nodecpp::assert::AssertLevel::critical, reinterpret_cast<uint8_t*>(h) + ((uintptr_t)(h->getPageCount()) << PAGE_SIZE_EXP) == reinterpret_cast<uint8_t*>( next ) );
				removeFromFreeList( static_cast<FreeChunkHeader*>(next) );
				h->set( h->prevInBlock(), next->nextInBlock(), h->getPageCount() + next->getPageCount(), true );
			}

			FreeChunkHeader* hfree = static_cast<FreeChunkHeader*>(h);
			uint16_t idx = hfree->getPageCount() - 1;
			if ( idx >= max_pages )
				idx = max_pages;
			hfree->prevFree = nullptr;
			hfree->nextFree = freeListBegin[idx];
			if ( freeListBegin[idx] != nullptr )
				freeListBegin[idx]->prevFree = hfree;
			freeListBegin[idx] = hfree;

#ifdef BULKALLOCATOR_HEAVY_DEBUG
		dbgValidateAllBlocks();
		dbgValidateAllFreeLists();
#endif
		}
		else
		{
			size_t deallocSize = (size_t)(h->prevInBlock());
			this->freeChunkNoCache( ptr, deallocSize );
		}

	}